

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O2

void __thiscall CJsonWriter::PushState(CJsonWriter *this,uchar NewState)

{
  long lVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                 ,0xb7,(uint)(this->m_NumStates < 0x10),"max json depth exceeded");
  lVar1 = (long)this->m_NumStates;
  if (lVar1 != 0) {
    this->m_aStates[lVar1 + -1].m_Empty = false;
  }
  this->m_aStates[lVar1] = (CState)(NewState + 0x100);
  this->m_NumStates = this->m_NumStates + 1;
  if (NewState != '\x03') {
    this->m_Indentation = this->m_Indentation + 1;
  }
  return;
}

Assistant:

void CJsonWriter::PushState(unsigned char NewState)
{
	dbg_assert(m_NumStates < MAX_DEPTH, "max json depth exceeded");
	if(m_NumStates != 0)
	{
		m_aStates[m_NumStates - 1].m_Empty = false;
	}
	m_aStates[m_NumStates] = CState(NewState);
	m_NumStates++;
	if(NewState != STATE_ATTRIBUTE)
	{
		m_Indentation++;
	}
}